

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service_base.hpp
# Opt level: O1

int __thiscall
asio::detail::reactive_socket_service_base::listen
          (reactive_socket_service_base *this,int __fd,int __n)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  error_category *peVar4;
  error_code *in_RCX;
  undefined4 in_register_00000034;
  int __fd_00;
  
  __fd_00 = *(int *)CONCAT44(in_register_00000034,__fd);
  if (__fd_00 == -1) {
    std::error_code::operator=(in_RCX,bad_descriptor);
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0;
    iVar2 = ::listen(__fd_00,__n);
    iVar1 = *piVar3;
    if (system_category()::instance == '\0') {
      listen(__fd_00,__n);
    }
    in_RCX->_M_value = iVar1;
    in_RCX->_M_cat = (error_category *)&system_category()::instance;
    if (iVar2 == 0) {
      peVar4 = (error_category *)std::_V2::system_category();
      in_RCX->_M_value = 0;
      in_RCX->_M_cat = peVar4;
    }
  }
  return in_RCX->_M_value;
}

Assistant:

asio::error_code listen(base_implementation_type& impl,
      int backlog, asio::error_code& ec)
  {
    socket_ops::listen(impl.socket_, backlog, ec);
    return ec;
  }